

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O2

utf8proc_ssize_t
utf8proc_reencode(utf8proc_int32_t *buffer,utf8proc_ssize_t length,utf8proc_option_t options)

{
  uint uVar1;
  long lVar2;
  utf8proc_ssize_t uVar3;
  long lVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar2 = utf8proc_normalize_utf32(buffer,length,options);
  if (-1 < lVar2) {
    if ((options >> 0xb & 1) == 0) {
      lVar8 = 0;
      for (lVar7 = 0; lVar2 != lVar7; lVar7 = lVar7 + 1) {
        uVar3 = utf8proc_encode_char(buffer[lVar7],(utf8proc_uint8_t *)((long)buffer + lVar8));
        lVar8 = lVar8 + uVar3;
      }
    }
    else {
      lVar7 = 1;
      lVar8 = 0;
      for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
        uVar1 = buffer[lVar4];
        if ((int)uVar1 < 0) {
LAB_0011befa:
          lVar6 = 0;
        }
        else {
          bVar5 = (byte)uVar1;
          lVar6 = lVar7;
          if (uVar1 < 0x80) {
            *(byte *)((long)buffer + lVar8) = bVar5;
          }
          else if (uVar1 < 0x800) {
            *(byte *)((long)buffer + lVar8) = (byte)(uVar1 >> 6) | 0xc0;
            *(byte *)((long)buffer + lVar8 + 1) = bVar5 & 0x3f | 0x80;
            lVar6 = 2;
          }
          else if (uVar1 == 0xfffe) {
            *(undefined1 *)((long)buffer + lVar8) = 0xfe;
          }
          else if (uVar1 == 0xffff) {
            *(undefined1 *)((long)buffer + lVar8) = 0xff;
          }
          else if (uVar1 < 0x10000) {
            *(byte *)((long)buffer + lVar8) = (byte)(uVar1 >> 0xc) | 0xe0;
            *(byte *)((long)buffer + lVar8 + 1) = (byte)(uVar1 >> 6) & 0x3f | 0x80;
            *(byte *)((long)buffer + lVar8 + 2) = bVar5 & 0x3f | 0x80;
            lVar6 = 3;
          }
          else {
            if (0x10ffff < uVar1) goto LAB_0011befa;
            *(byte *)((long)buffer + lVar8) = (byte)(uVar1 >> 0x12) | 0xf0;
            *(byte *)((long)buffer + lVar8 + 1) = (byte)(uVar1 >> 0xc) & 0x3f | 0x80;
            *(byte *)((long)buffer + lVar8 + 2) = (byte)(uVar1 >> 6) & 0x3f | 0x80;
            *(byte *)((long)buffer + lVar8 + 3) = bVar5 & 0x3f | 0x80;
            lVar6 = 4;
          }
        }
        lVar8 = lVar8 + lVar6;
      }
    }
    *(undefined1 *)((long)buffer + lVar8) = 0;
    lVar2 = lVar8;
  }
  return lVar2;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_reencode(utf8proc_int32_t *buffer, utf8proc_ssize_t length, utf8proc_option_t options) {
  /* UTF8PROC_NULLTERM option will be ignored, 'length' is never ignored
     ASSERT: 'buffer' has one spare byte of free space at the end! */
  length = utf8proc_normalize_utf32(buffer, length, options);
  if (length < 0) return length;
  {
    utf8proc_ssize_t rpos, wpos = 0;
    utf8proc_int32_t uc;
    if (options & UTF8PROC_CHARBOUND) {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += unsafe_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    } else {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += utf8proc_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    }
    ((utf8proc_uint8_t *)buffer)[wpos] = 0;
    return wpos;
  }
}